

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetFieldOrdinal
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  __type _Var1;
  ulong uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type sVar4;
  const_reference __lhs;
  string *psVar5;
  LogMessage *pLVar6;
  LogFinisher local_6d [13];
  LogMessage local_60;
  int local_24;
  FieldDescriptor *pFStack_20;
  int i;
  FieldDescriptor *descriptor_local;
  MessageGenerator *this_local;
  
  local_24 = 0;
  pFStack_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  while( true ) {
    uVar2 = (ulong)local_24;
    pvVar3 = field_names_abi_cxx11_(this);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar3);
    if (sVar4 <= uVar2) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
                 ,0x21b);
      pLVar6 = internal::LogMessage::operator<<(&local_60,"Could not find ordinal for field ");
      psVar5 = FieldDescriptor::name_abi_cxx11_(pFStack_20);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar5);
      internal::LogFinisher::operator=(local_6d,pLVar6);
      internal::LogMessage::~LogMessage(&local_60);
      return -1;
    }
    pvVar3 = field_names_abi_cxx11_(this);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar3,(long)local_24);
    psVar5 = FieldDescriptor::name_abi_cxx11_(pFStack_20);
    _Var1 = std::operator==(__lhs,psVar5);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int MessageGenerator::GetFieldOrdinal(const FieldDescriptor* descriptor) {
  for (int i = 0; i < field_names().size(); i++) {
    if (field_names()[i] == descriptor->name()) {
      return i;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find ordinal for field " << descriptor->name();
  return -1;
}